

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,str_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  size_t __n;
  size_t size_1;
  void *__s;
  void *__dest;
  char __tmp;
  ulong uVar5;
  basic_buffer<char> *c;
  ulong uVar6;
  size_t __len;
  size_t __n_00;
  unsigned_long __n2_2;
  
  uVar5 = (ulong)spec->width_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n_00 = uVar5 - size;
  if (uVar5 < size || __n_00 == 0) {
    uVar5 = size + lVar3;
    if ((ulong)puVar2[3] < uVar5) {
      (**(code **)*puVar2)(puVar2,uVar5);
    }
    puVar2[2] = uVar5;
    __n = f->size;
    if (__n != 0) {
      __dest = (void *)(lVar3 + puVar2[1]);
LAB_0018b124:
      memmove(__dest,f->s,__n);
      return;
    }
  }
  else {
    uVar6 = lVar3 + uVar5;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
    }
    puVar2[2] = uVar6;
    __s = (void *)(lVar3 + puVar2[1]);
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar6 = __n_00 >> 1;
      if (1 < __n_00) {
        memset(__s,(uint)bVar1,uVar6);
        __s = (void *)((long)__s + uVar6);
      }
      sVar4 = f->size;
      if (sVar4 != 0) {
        memmove(__s,f->s,sVar4);
        __s = (void *)((long)__s + sVar4);
      }
      if (uVar5 != size) {
        __n_00 = __n_00 - uVar6;
LAB_0018b1cb:
        memset(__s,(uint)bVar1,__n_00);
        return;
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      __dest = __s;
      if (uVar5 != size) {
        __dest = (void *)((long)__s + __n_00);
        memset(__s,(uint)bVar1,__n_00);
      }
      __n = f->size;
      if (__n != 0) goto LAB_0018b124;
    }
    else {
      sVar4 = f->size;
      if (sVar4 != 0) {
        memmove(__s,f->s,sVar4);
        __s = (void *)((long)__s + sVar4);
      }
      if (uVar5 != size) goto LAB_0018b1cb;
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F &&f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}